

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test::
~TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test
          (TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, freeOnlyTheMemoryInTheAllocationStage)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    detector->increaseAllocationStage();
    detector->allocMemory(defaultMallocAllocator(), 2);
    detector->deallocAllMemoryInCurrentAllocationStage();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}